

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_modp(mbedtls_mpi *N,mbedtls_ecp_group *grp)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  int local_24;
  int ret;
  mbedtls_ecp_group *grp_local;
  mbedtls_mpi *N_local;
  
  if (grp->modp == (_func_int_mbedtls_mpi_ptr *)0x0) {
    iVar1 = mbedtls_mpi_mod_mpi(N,N,&grp->P);
    return iVar1;
  }
  if (((-1 < N->s) || (iVar1 = mbedtls_mpi_cmp_int(N,0), iVar1 == 0)) &&
     (sVar2 = mbedtls_mpi_bitlen(N), sVar2 <= grp->pbits * 2)) {
    iVar1 = (*grp->modp)(N);
    while( true ) {
      if (iVar1 != 0) {
        return iVar1;
      }
      bVar3 = false;
      if (N->s < 0) {
        iVar1 = mbedtls_mpi_cmp_int(N,0);
        bVar3 = iVar1 != 0;
      }
      local_24 = 0;
      if (!bVar3) break;
      iVar1 = mbedtls_mpi_add_mpi(N,N,&grp->P);
    }
    do {
      iVar1 = mbedtls_mpi_cmp_mpi(N,&grp->P);
      if (iVar1 < 0) {
        return local_24;
      }
      local_24 = mbedtls_mpi_sub_abs(N,N,&grp->P);
    } while (local_24 == 0);
    return local_24;
  }
  return -0x4f80;
}

Assistant:

static int ecp_modp( mbedtls_mpi *N, const mbedtls_ecp_group *grp )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if( grp->modp == NULL )
        return( mbedtls_mpi_mod_mpi( N, N, &grp->P ) );

    /* N->s < 0 is a much faster test, which fails only if N is 0 */
    if( ( N->s < 0 && mbedtls_mpi_cmp_int( N, 0 ) != 0 ) ||
        mbedtls_mpi_bitlen( N ) > 2 * grp->pbits )
    {
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
    }

    MBEDTLS_MPI_CHK( grp->modp( N ) );

    /* N->s < 0 is a much faster test, which fails only if N is 0 */
    while( N->s < 0 && mbedtls_mpi_cmp_int( N, 0 ) != 0 )
        MBEDTLS_MPI_CHK( mbedtls_mpi_add_mpi( N, N, &grp->P ) );

    while( mbedtls_mpi_cmp_mpi( N, &grp->P ) >= 0 )
        /* we known P, N and the result are positive */
        MBEDTLS_MPI_CHK( mbedtls_mpi_sub_abs( N, N, &grp->P ) );

cleanup:
    return( ret );
}